

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

TestCase * TestCharReaderTestparseWithDetailError::factory(void)

{
  TestCase *this;
  
  this = (TestCase *)operator_new(0x10);
  (((CharReaderTest *)&this->_vptr_TestCase)->super_TestCase)._vptr_TestCase = (_func_int **)0x0;
  this->result_ = (TestResult *)0x0;
  TestCharReaderTestparseWithDetailError((TestCharReaderTestparseWithDetailError *)this);
  return this;
}

Assistant:

JSONTEST_FIXTURE(CharReaderTest, parseWithDetailError) {
  Json::CharReaderBuilder b;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  Json::Value root;
  char const doc[] =
      "{ \"property\" : \"v\\alue\" }";
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(!ok);
  JSONTEST_ASSERT(errs ==
                  "* Line 1, Column 16\n  Bad escape sequence in string\nSee "
                  "Line 1, Column 20 for detail.\n");
  delete reader;
}